

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_symbols.cxx
# Opt level: O1

int fl_add_symbol(char *name,_func_void_Fl_Color *drawit,int scalable)

{
  int iVar1;
  int iVar2;
  
  fl_init_symbols();
  iVar1 = symbnumb;
  if (symbnumb < 0x6a) {
    iVar2 = find(name);
    symbols[iVar2].name = name;
    symbols[iVar2].drawit = drawit;
    symbols[iVar2].notempty = '\x01';
    symbols[iVar2].scalable = (char)scalable;
    symbnumb = iVar1 + 1;
  }
  return (uint)(iVar1 < 0x6a);
}

Assistant:

int fl_add_symbol(const char *name, void (*drawit)(Fl_Color), int scalable)
{
  fl_init_symbols();
  int pos;
  if (symbnumb > MAXSYMBOL / 2) return 0;	// table is full
  pos = find(name);
  symbols[pos].name = name;
  symbols[pos].drawit = drawit;
  symbols[pos].notempty = 1;
  symbols[pos].scalable = scalable;
  symbnumb++;
  return 1;
}